

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AddJoin(Clipper *this,OutPt *op1,OutPt *op2,IntPoint OffPt)

{
  Join *j;
  
  j = (Join *)operator_new(0x20);
  j->OutPt1 = op1;
  j->OutPt2 = op2;
  (j->OffPt).X = OffPt.X;
  (j->OffPt).Y = OffPt.Y;
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::push_back(&this->m_Joins,&j)
  ;
  return;
}

Assistant:

void Clipper::AddJoin(OutPt *op1, OutPt *op2, const IntPoint OffPt)
{
  Join* j = new Join;
  j->OutPt1 = op1;
  j->OutPt2 = op2;
  j->OffPt = OffPt;
  m_Joins.push_back(j);
}